

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetRed
          (InstructionDisassembler *this,ostream *stream)

{
  char *__s;
  size_t sVar1;
  red local_11;
  
  if (this->color_ == true) {
    __s = clr::red::operator_cast_to_char_(&local_11);
    if (__s == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
    }
  }
  return;
}

Assistant:

void InstructionDisassembler::SetRed(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::red{print_};
}